

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void drawImage7(Array<Imf_3_2::Rgba> *px,int w,int h,int y)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  Rgba *p;
  float r;
  float a;
  float yc;
  float xc;
  int x;
  float f;
  int iVar5;
  undefined4 local_18;
  
  for (local_18 = 0.0; (int)local_18 < in_ESI; local_18 = (float)((int)local_18 + 1)) {
    fVar1 = (float)((int)local_18 - in_ESI / 2);
    fVar2 = (float)(in_ECX - in_EDX / 2);
    f = local_18;
    iVar5 = in_ECX;
    dVar4 = std::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)fVar2);
    fVar3 = SUB84(dVar4,0);
    dVar4 = std::sqrt((double)(ulong)(uint)(fVar1 * fVar1 + fVar2 * fVar2));
    fVar2 = SUB84(dVar4,0);
    Imf_3_2::Array::operator_cast_to_Rgba_(in_RDI);
    fVar1 = fVar3;
    dVar4 = std::sin((double)(ulong)(uint)(fVar2 * 0.1));
    std::sin((double)(ulong)(uint)(fVar1 * 3.0 + SUB84(dVar4,0) * 0.3));
    Imath_3_2::half::operator=((half *)CONCAT44(fVar1,iVar5),f);
    dVar4 = std::sin((double)(ulong)(uint)(fVar2 * 0.11));
    std::sin((double)(ulong)(uint)(fVar3 * 3.0 + SUB84(dVar4,0) * 0.3));
    Imath_3_2::half::operator=((half *)CONCAT44(fVar1,iVar5),f);
    dVar4 = std::sin((double)(ulong)(uint)(fVar2 * 0.12));
    std::sin((double)(ulong)(uint)(fVar3 * 3.0 + SUB84(dVar4,0) * 0.3));
    Imath_3_2::half::operator=((half *)CONCAT44(fVar1,iVar5),f);
    Imath_3_2::half::operator=((half *)CONCAT44(fVar1,iVar5),f);
  }
  return;
}

Assistant:

void
drawImage7 (Array<Rgba>& px, int w, int h, int y)
{
    for (int x = 0; x < w; ++x)
    {
        float xc = x - w / 2;
        float yc = y - h / 2;
        float a  = atan2 (xc, yc);
        float r  = sqrt (xc * xc + yc * yc);

        Rgba& p = px[x];
        p.r     = sin (3.0f * a + 0.3f * sin (0.10f * r)) * 0.5f + 0.5f;
        p.g     = sin (3.0f * a + 0.3f * sin (0.11f * r)) * 0.5f + 0.5f;
        p.b     = sin (3.0f * a + 0.3f * sin (0.12f * r)) * 0.5f + 0.5f;
        p.a     = 1;
    }
}